

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

RegNum __thiscall
LinearScan::SpillLiveRange(LinearScan *this,Lifetime *spilledRange,Instr *insertionInstr)

{
  RegNum reg_00;
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  StackSym *this_00;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  uint uVar7;
  uint functionId;
  undefined4 *puVar8;
  StackSym *sym;
  RegNum reg;
  Instr *insertionInstr_local;
  Lifetime *spilledRange_local;
  LinearScan *this_local;
  
  if ((*(ushort *)&spilledRange->field_0x9c & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb13,"(!spilledRange->isSpilled)","!spilledRange->isSpilled");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  reg_00 = spilledRange->reg;
  this_00 = spilledRange->sym;
  *(ushort *)&spilledRange->field_0x9c = *(ushort *)&spilledRange->field_0x9c & 0xfffe | 1;
  *(ushort *)&spilledRange->field_0x9c = *(ushort *)&spilledRange->field_0x9c & 0xfbff;
  spilledRange->reg = RegNOREG;
  bVar5 = StackSym::IsAllocated(this_00);
  if ((!bVar5) &&
     ((bVar5 = StackSym::IsConst(this_00), !bVar5 ||
      (bVar5 = IsSymNonTempLocalVar(this,this_00), bVar5)))) {
    AllocateStackSpace(this,spilledRange);
  }
  if ((*(ushort *)&spilledRange->field_0x9c >> 3 & 1) == 0) {
    bVar5 = IsSymNonTempLocalVar(this,this_00);
    if (!bVar5) {
      InsertStores(this,spilledRange,reg_00,insertionInstr);
    }
    bVar5 = IsInLoop(this);
    if ((bVar5) || (bVar5 = StackSym::IsConst(this_00), bVar5)) {
      InsertLoads(this,this_00,reg_00);
    }
    else {
      SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear
                ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                 ((long)this_00->scratch + 0x30));
    }
    Lifetime::ApplyUseCountAdjust(spilledRange,this->curLoop);
  }
  if (((reg_00 != RegNOREG) && (spilledRange->reg != RegNOREG)) &&
     (this->regContent[reg_00] != spilledRange)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb38,
                       "(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange)"
                       ,
                       "reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange"
                      );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((*(ushort *)&spilledRange->field_0x9c >> 9 & 1) == 0) {
    BVar6 = BVUnitT<unsigned_long>::Test(&this->secondChanceRegs,(uint)reg_00);
    if (BVar6 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xb42,"(!this->secondChanceRegs.Test(reg))",
                         "!this->secondChanceRegs.Test(reg)");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  else {
    if (((reg_00 != RegNOREG) && (spilledRange->reg != RegNOREG)) &&
       ((this->regContent[reg_00] != spilledRange ||
        (BVar6 = BVUnitT<unsigned_long>::Test(&this->secondChanceRegs,(uint)reg_00), BVar6 == '\0'))
       )) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xb3c,
                         "(reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)))"
                         ,
                         "reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg))"
                        );
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    BVUnitT<unsigned_long>::Clear(&this->secondChanceRegs,(uint)reg_00);
    *(ushort *)&spilledRange->field_0x9c = *(ushort *)&spilledRange->field_0x9c & 0xfdff;
  }
  this->regContent[reg_00] = (Lifetime *)0x0;
  uVar7 = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,LinearScanPhase,uVar7,functionId);
  if (bVar5) {
    Output::Print(L"**** Spill: ");
    Sym::Dump(&this_00->super_Sym,ValueType::Uninitialized);
    Output::Print(L"(%S)",RegNames[reg_00]);
    uVar1 = spilledRange->useCount;
    uVar2 = spilledRange->end;
    uVar3 = spilledRange->start;
    uVar7 = GetSpillCost(this,spilledRange);
    Output::Print(L"  SpillCount:%d  Length:%d   Cost:%d\n",(ulong)uVar1,(ulong)(uVar2 - uVar3),
                  (ulong)uVar7);
  }
  return reg_00;
}

Assistant:

RegNum
LinearScan::SpillLiveRange(Lifetime * spilledRange, IR::Instr *insertionInstr)
{
    Assert(!spilledRange->isSpilled);

    RegNum reg = spilledRange->reg;
    StackSym *sym = spilledRange->sym;

    spilledRange->isSpilled = true;
    spilledRange->isCheapSpill = false;
    spilledRange->reg = RegNOREG;

    // Don't allocate stack space for const, we always reload them. (For debugm mode, allocate on the stack)
    if (!sym->IsAllocated() && (!sym->IsConst() || IsSymNonTempLocalVar(sym)))
    {
       this->AllocateStackSpace(spilledRange);
    }

    // No need to insert loads or stores if there are no uses.
    if (!spilledRange->isDeadStore)
    {
        // In the debug mode, don't do insertstore for this stacksym, as we want to retain the IsConst for the sym,
        // and later we are going to find the reg for it.
        if (!IsSymNonTempLocalVar(sym))
        {
            this->InsertStores(spilledRange, reg, insertionInstr);
        }

        if (this->IsInLoop() || sym->IsConst())
        {
            this->InsertLoads(sym, reg);
        }
        else
        {
            sym->scratch.linearScan.lifetime->useList.Clear();
        }
        // Adjust useCount in case of second chance allocation
        spilledRange->ApplyUseCountAdjust(this->curLoop);
    }

    Assert(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange);
    if (spilledRange->isSecondChanceAllocated)
    {
        Assert(reg == RegNOREG || spilledRange->reg == RegNOREG
            || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)));
        this->secondChanceRegs.Clear(reg);
        spilledRange->isSecondChanceAllocated = false;
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(reg));
    }
    this->regContent[reg] = nullptr;

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("**** Spill: "));
        sym->Dump();
        Output::Print(_u("(%S)"), RegNames[reg]);
        Output::Print(_u("  SpillCount:%d  Length:%d   Cost:%d\n"),
            spilledRange->useCount, spilledRange->end - spilledRange->start, this->GetSpillCost(spilledRange));
    }
#endif
    return reg;
}